

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

void assign_tensor(TENSOR *tensor,float **buf,int channels,int width,int height,int stride)

{
  ulong uVar1;
  ulong uVar2;
  
  tensor->allocsize = 0;
  tensor->channels = channels;
  tensor->width = width;
  tensor->height = height;
  tensor->stride = stride;
  uVar1 = 0;
  if (0 < channels) {
    uVar1 = (ulong)(uint)channels;
  }
  uVar2 = 0;
  if (buf == (float **)0x0) {
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      tensor->buf[uVar2] = (float *)0x0;
    }
  }
  else {
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      tensor->buf[uVar2] = buf[uVar2];
    }
  }
  return;
}

Assistant:

static void assign_tensor(TENSOR *tensor, float *buf[CNN_MAX_CHANNELS],
                          int channels, int width, int height, int stride) {
  tensor->allocsize = 0;
  tensor->channels = channels;
  tensor->width = width;
  tensor->height = height;
  tensor->stride = stride;
  if (buf) {
    for (int c = 0; c < channels; ++c) tensor->buf[c] = buf[c];
  } else {
    for (int c = 0; c < channels; ++c) tensor->buf[c] = NULL;
  }
}